

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::changeColsIntegrality(Highs *this,HighsInt *mask,HighsVarType *integrality)

{
  HighsStatus HVar1;
  HighsStatus return_status;
  HighsStatus call_status;
  bool create_error;
  HighsIndexCollection index_collection;
  HighsLogOptions *in_stack_fffffffffffffea8;
  HighsStatus in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  HighsStatus HVar2;
  HighsInt in_stack_fffffffffffffeec;
  string *in_stack_fffffffffffffef0;
  HighsStatus in_stack_fffffffffffffef8;
  HighsStatus in_stack_fffffffffffffefc;
  Highs *in_stack_ffffffffffffff00;
  HighsVarType *in_stack_ffffffffffffff48;
  HighsIndexCollection *in_stack_ffffffffffffff50;
  Highs *in_stack_ffffffffffffff58;
  HighsStatus local_4;
  
  clearPresolve((Highs *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  HighsIndexCollection::HighsIndexCollection
            ((HighsIndexCollection *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  create((HighsIndexCollection *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
         (HighsInt *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  changeIntegralityInterface
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffea8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffef0,"changeIntegrality",
             (allocator *)&stack0xfffffffffffffeef);
  HVar1 = interpretCallStatus((HighsLogOptions *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc
                              ,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  HVar2 = HVar1;
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeef);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x493205);
  if (HVar1 == kError) {
    local_4 = kError;
  }
  else {
    in_stack_fffffffffffffeb0 = returnFromHighs(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc)
    ;
    local_4 = in_stack_fffffffffffffeb0;
  }
  HighsIndexCollection::~HighsIndexCollection
            ((HighsIndexCollection *)CONCAT44(HVar2,in_stack_fffffffffffffeb0));
  return local_4;
}

Assistant:

HighsStatus Highs::changeColsIntegrality(const HighsInt* mask,
                                         const HighsVarType* integrality) {
  clearPresolve();
  HighsIndexCollection index_collection;
  const bool create_error = create(index_collection, mask, model_.lp_.num_col_);
  assert(!create_error);
  (void)create_error;
  HighsStatus call_status =
      changeIntegralityInterface(index_collection, integrality);
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeIntegrality");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}